

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void google::protobuf::anon_unknown_1::InitGeneratedPool(void)

{
  EncodedDescriptorDatabase *this;
  DescriptorPool *this_00;
  
  this = (EncodedDescriptorDatabase *)operator_new(0xb0);
  EncodedDescriptorDatabase::EncodedDescriptorDatabase(this);
  (anonymous_namespace)::generated_database_ = this;
  this_00 = (DescriptorPool *)operator_new(0x68);
  DescriptorPool::DescriptorPool
            (this_00,&(anonymous_namespace)::generated_database_->super_DescriptorDatabase,
             (ErrorCollector *)0x0);
  (anonymous_namespace)::generated_pool_ = this_00;
  DescriptorPool::InternalSetLazilyBuildDependencies(this_00);
  internal::OnShutdown(DeleteGeneratedPool);
  return;
}

Assistant:

static void InitGeneratedPool() {
  generated_database_ = new EncodedDescriptorDatabase;
  generated_pool_ = new DescriptorPool(generated_database_);
  generated_pool_->InternalSetLazilyBuildDependencies();

  internal::OnShutdown(&DeleteGeneratedPool);
}